

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise_x86_avx::forward
          (Eltwise_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  Mat *m;
  Mat *this_00;
  _func_int **pp_Var5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  undefined1 auVar13 [32];
  float fVar14;
  undefined1 auVar15 [32];
  int q;
  ulong uVar16;
  ulong uVar17;
  _func_int *p_Var18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  pointer pMVar25;
  long lVar26;
  int iVar27;
  undefined1 (*pauVar28) [32];
  undefined1 (*pauVar29) [32];
  float *pfVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar4 = m->c;
  uVar16 = (ulong)uVar4;
  iVar21 = m->h * m->w * m->d * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar27 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pp_Var5 = this->_vptr_Eltwise_x86_avx;
    p_Var18 = pp_Var5[-3];
    iVar27 = *(int *)(&this->field_0xd0 + (long)p_Var18);
    if (iVar27 == 0) {
      pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar20 = 0;
      uVar31 = 0;
      if (0 < (int)uVar4) {
        uVar31 = uVar16;
      }
      for (; uVar20 != uVar31; uVar20 = uVar20 + 1) {
        lVar22 = this_00->elemsize * this_00->cstep * uVar20;
        pvVar6 = this_00->data;
        lVar24 = pMVar25[1].elemsize * pMVar25[1].cstep * uVar20;
        pvVar7 = pMVar25[1].data;
        lVar23 = m->elemsize * m->cstep * uVar20;
        pvVar8 = m->data;
        lVar26 = 0;
        lVar19 = 0;
        for (iVar27 = 0; iVar27 + 7 < iVar21; iVar27 = iVar27 + 8) {
          pfVar30 = (float *)((long)pvVar7 + lVar19 + lVar24);
          pfVar1 = (float *)((long)pvVar8 + lVar19 + lVar23);
          auVar13._4_4_ = pfVar30[1] * pfVar1[1];
          auVar13._0_4_ = *pfVar30 * *pfVar1;
          auVar13._8_4_ = pfVar30[2] * pfVar1[2];
          auVar13._12_4_ = pfVar30[3] * pfVar1[3];
          auVar13._16_4_ = pfVar30[4] * pfVar1[4];
          auVar13._20_4_ = pfVar30[5] * pfVar1[5];
          auVar13._24_4_ = pfVar30[6] * pfVar1[6];
          auVar13._28_4_ = pfVar30[7];
          *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar22) = auVar13;
          lVar19 = lVar19 + 0x20;
          lVar26 = lVar26 + 8;
        }
        for (; iVar27 + 3 < iVar21; iVar27 = iVar27 + 4) {
          pfVar30 = (float *)((long)pvVar7 + lVar19 + lVar24);
          pfVar1 = (float *)((long)pvVar8 + lVar19 + lVar23);
          auVar32._0_4_ = *pfVar30 * *pfVar1;
          auVar32._4_4_ = pfVar30[1] * pfVar1[1];
          auVar32._8_4_ = pfVar30[2] * pfVar1[2];
          auVar32._12_4_ = pfVar30[3] * pfVar1[3];
          *(undefined1 (*) [16])((long)pvVar6 + lVar19 + lVar22) = auVar32;
          lVar19 = lVar19 + 0x10;
          lVar26 = lVar26 + 4;
        }
        for (; (int)lVar26 < iVar21; lVar26 = lVar26 + 1) {
          *(float *)((long)pvVar6 + lVar26 * 4 + lVar22) =
               *(float *)((long)pvVar7 + lVar26 * 4 + lVar24) *
               *(float *)((long)pvVar8 + lVar26 * 4 + lVar23);
        }
      }
      for (uVar20 = 2;
          pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar20 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar25) / 0x48);
          uVar20 = uVar20 + 1) {
        pMVar25 = pMVar25 + uVar20;
        for (uVar17 = 0; uVar17 != uVar31; uVar17 = uVar17 + 1) {
          pvVar6 = pMVar25->data;
          sVar9 = pMVar25->elemsize;
          sVar10 = pMVar25->cstep;
          pfVar30 = (float *)(sVar10 * uVar17 * sVar9 + (long)pvVar6);
          pvVar7 = this_00->data;
          sVar11 = this_00->elemsize;
          sVar12 = this_00->cstep;
          pauVar28 = (undefined1 (*) [32])(sVar12 * uVar17 * sVar11 + (long)pvVar7);
          lVar19 = 0;
          for (iVar27 = 0; iVar27 + 7 < iVar21; iVar27 = iVar27 + 8) {
            auVar15._4_4_ = pfVar30[1] * *(float *)((long)*pauVar28 + 4);
            auVar15._0_4_ = *pfVar30 * *(float *)*pauVar28;
            auVar15._8_4_ = pfVar30[2] * *(float *)((long)*pauVar28 + 8);
            auVar15._12_4_ = pfVar30[3] * *(float *)((long)*pauVar28 + 0xc);
            auVar15._16_4_ = pfVar30[4] * *(float *)((long)*pauVar28 + 0x10);
            auVar15._20_4_ = pfVar30[5] * *(float *)((long)*pauVar28 + 0x14);
            auVar15._24_4_ = pfVar30[6] * *(float *)((long)*pauVar28 + 0x18);
            auVar15._28_4_ = pfVar30[7];
            *pauVar28 = auVar15;
            pfVar30 = pfVar30 + 8;
            pauVar28 = pauVar28 + 1;
            lVar19 = lVar19 + 8;
          }
          for (; iVar27 + 3 < iVar21; iVar27 = iVar27 + 4) {
            auVar33._0_4_ = *pfVar30 * *(float *)*pauVar28;
            auVar33._4_4_ = pfVar30[1] * *(float *)((long)*pauVar28 + 4);
            auVar33._8_4_ = pfVar30[2] * *(float *)((long)*pauVar28 + 8);
            auVar33._12_4_ = pfVar30[3] * *(float *)((long)*pauVar28 + 0xc);
            *(undefined1 (*) [16])*pauVar28 = auVar33;
            pfVar30 = pfVar30 + 4;
            pauVar28 = (undefined1 (*) [32])((long)*pauVar28 + 0x10);
            lVar19 = lVar19 + 4;
          }
          lVar22 = sVar12 * sVar11 * uVar17;
          for (; (int)lVar19 < iVar21; lVar19 = lVar19 + 1) {
            *(float *)((long)pvVar7 + lVar19 * 4 + lVar22) =
                 *(float *)((long)pvVar7 + lVar19 * 4 + lVar22) *
                 *(float *)((long)pvVar6 + lVar19 * 4 + sVar10 * sVar9 * uVar17);
          }
        }
      }
      p_Var18 = pp_Var5[-3];
      iVar27 = *(int *)(&this->field_0xd0 + (long)p_Var18);
    }
    if (iVar27 == 1) {
      pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (*(int *)(&this->field_0x104 + (long)p_Var18) == 0) {
        uVar20 = 0;
        uVar31 = 0;
        if (0 < (int)uVar4) {
          uVar31 = uVar16;
        }
        for (; uVar20 != uVar31; uVar20 = uVar20 + 1) {
          lVar19 = this_00->elemsize * this_00->cstep * uVar20;
          pvVar6 = this_00->data;
          lVar23 = pMVar25[1].elemsize * pMVar25[1].cstep * uVar20;
          pvVar7 = pMVar25[1].data;
          lVar22 = m->elemsize * m->cstep * uVar20;
          pvVar8 = m->data;
          lVar24 = 0;
          lVar26 = 0;
          for (iVar27 = 0; iVar27 + 7 < iVar21; iVar27 = iVar27 + 8) {
            pfVar30 = (float *)((long)pvVar7 + lVar26 + lVar23);
            pfVar1 = (float *)((long)pvVar8 + lVar26 + lVar22);
            auVar38._0_4_ = *pfVar30 + *pfVar1;
            auVar38._4_4_ = pfVar30[1] + pfVar1[1];
            auVar38._8_4_ = pfVar30[2] + pfVar1[2];
            auVar38._12_4_ = pfVar30[3] + pfVar1[3];
            auVar38._16_4_ = pfVar30[4] + pfVar1[4];
            auVar38._20_4_ = pfVar30[5] + pfVar1[5];
            auVar38._24_4_ = pfVar30[6] + pfVar1[6];
            auVar38._28_4_ = pfVar30[7] + pfVar1[7];
            *(undefined1 (*) [32])((long)pvVar6 + lVar26 + lVar19) = auVar38;
            lVar26 = lVar26 + 0x20;
            lVar24 = lVar24 + 8;
          }
          for (; iVar27 + 3 < iVar21; iVar27 = iVar27 + 4) {
            pfVar30 = (float *)((long)pvVar7 + lVar26 + lVar23);
            pfVar1 = (float *)((long)pvVar8 + lVar26 + lVar22);
            auVar36._0_4_ = *pfVar30 + *pfVar1;
            auVar36._4_4_ = pfVar30[1] + pfVar1[1];
            auVar36._8_4_ = pfVar30[2] + pfVar1[2];
            auVar36._12_4_ = pfVar30[3] + pfVar1[3];
            *(undefined1 (*) [16])((long)pvVar6 + lVar26 + lVar19) = auVar36;
            lVar26 = lVar26 + 0x10;
            lVar24 = lVar24 + 4;
          }
          for (; (int)lVar24 < iVar21; lVar24 = lVar24 + 1) {
            *(float *)((long)pvVar6 + lVar24 * 4 + lVar19) =
                 *(float *)((long)pvVar7 + lVar24 * 4 + lVar23) +
                 *(float *)((long)pvVar8 + lVar24 * 4 + lVar22);
          }
        }
        for (uVar20 = 2;
            pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar20 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar25) /
                            0x48); uVar20 = uVar20 + 1) {
          pMVar25 = pMVar25 + uVar20;
          for (uVar17 = 0; uVar17 != uVar31; uVar17 = uVar17 + 1) {
            pvVar6 = pMVar25->data;
            sVar9 = pMVar25->elemsize;
            sVar10 = pMVar25->cstep;
            pfVar30 = (float *)(sVar10 * uVar17 * sVar9 + (long)pvVar6);
            pvVar7 = this_00->data;
            sVar11 = this_00->elemsize;
            sVar12 = this_00->cstep;
            pauVar28 = (undefined1 (*) [32])(sVar12 * uVar17 * sVar11 + (long)pvVar7);
            lVar19 = 0;
            for (iVar27 = 0; iVar27 + 7 < iVar21; iVar27 = iVar27 + 8) {
              auVar39._0_4_ = *pfVar30 + *(float *)*pauVar28;
              auVar39._4_4_ = pfVar30[1] + *(float *)((long)*pauVar28 + 4);
              auVar39._8_4_ = pfVar30[2] + *(float *)((long)*pauVar28 + 8);
              auVar39._12_4_ = pfVar30[3] + *(float *)((long)*pauVar28 + 0xc);
              auVar39._16_4_ = pfVar30[4] + *(float *)((long)*pauVar28 + 0x10);
              auVar39._20_4_ = pfVar30[5] + *(float *)((long)*pauVar28 + 0x14);
              auVar39._24_4_ = pfVar30[6] + *(float *)((long)*pauVar28 + 0x18);
              auVar39._28_4_ = pfVar30[7] + *(float *)((long)*pauVar28 + 0x1c);
              *pauVar28 = auVar39;
              pfVar30 = pfVar30 + 8;
              pauVar28 = pauVar28 + 1;
              lVar19 = lVar19 + 8;
            }
            for (; iVar27 + 3 < iVar21; iVar27 = iVar27 + 4) {
              auVar37._0_4_ = *pfVar30 + *(float *)*pauVar28;
              auVar37._4_4_ = pfVar30[1] + *(float *)((long)*pauVar28 + 4);
              auVar37._8_4_ = pfVar30[2] + *(float *)((long)*pauVar28 + 8);
              auVar37._12_4_ = pfVar30[3] + *(float *)((long)*pauVar28 + 0xc);
              *(undefined1 (*) [16])*pauVar28 = auVar37;
              pfVar30 = pfVar30 + 4;
              pauVar28 = (undefined1 (*) [32])((long)*pauVar28 + 0x10);
              lVar19 = lVar19 + 4;
            }
            lVar22 = sVar12 * sVar11 * uVar17;
            for (; (int)lVar19 < iVar21; lVar19 = lVar19 + 1) {
              *(float *)((long)pvVar7 + lVar19 * 4 + lVar22) =
                   *(float *)((long)pvVar7 + lVar19 * 4 + lVar22) +
                   *(float *)((long)pvVar6 + lVar19 * 4 + sVar10 * sVar9 * uVar17);
            }
          }
        }
      }
      else {
        pp_Var5 = this->_vptr_Eltwise_x86_avx;
        uVar20 = 0;
        uVar31 = 0;
        if (0 < (int)uVar4) {
          uVar31 = uVar16;
        }
        for (; uVar20 != uVar31; uVar20 = uVar20 + 1) {
          fVar2 = **(float **)(&this->field_0xd8 + (long)pp_Var5[-3]);
          auVar34._4_4_ = fVar2;
          auVar34._0_4_ = fVar2;
          auVar34._8_4_ = fVar2;
          auVar34._12_4_ = fVar2;
          fVar3 = (*(float **)(&this->field_0xd8 + (long)pp_Var5[-3]))[1];
          auVar40._4_4_ = fVar3;
          auVar40._0_4_ = fVar3;
          auVar40._8_4_ = fVar3;
          auVar40._12_4_ = fVar3;
          in_ZMM1 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,auVar40
                                                                                      )))));
          lVar23 = m->elemsize * m->cstep * uVar20;
          pvVar6 = m->data;
          lVar24 = pMVar25[1].elemsize * pMVar25[1].cstep * uVar20;
          pvVar7 = pMVar25[1].data;
          lVar22 = this_00->elemsize * this_00->cstep * uVar20;
          pvVar8 = this_00->data;
          lVar19 = 0;
          lVar26 = 0;
          for (iVar27 = 0; iVar27 + 7 < iVar21; iVar27 = iVar27 + 8) {
            pfVar30 = (float *)((long)pvVar6 + lVar26 + lVar23);
            pfVar1 = (float *)((long)pvVar7 + lVar26 + lVar24);
            auVar44._0_4_ = fVar3 * *pfVar1;
            auVar44._4_4_ = fVar3 * pfVar1[1];
            auVar44._8_4_ = fVar3 * pfVar1[2];
            auVar44._12_4_ = fVar3 * pfVar1[3];
            auVar44._16_4_ = fVar3 * pfVar1[4];
            auVar44._20_4_ = fVar3 * pfVar1[5];
            auVar44._28_36_ = in_ZMM3._28_36_;
            auVar44._24_4_ = fVar3 * pfVar1[6];
            auVar43._0_4_ = auVar44._0_4_ + fVar2 * *pfVar30;
            auVar43._4_4_ = auVar44._4_4_ + fVar2 * pfVar30[1];
            auVar43._8_4_ = auVar44._8_4_ + fVar2 * pfVar30[2];
            auVar43._12_4_ = auVar44._12_4_ + fVar2 * pfVar30[3];
            auVar43._16_4_ = auVar44._16_4_ + fVar2 * pfVar30[4];
            auVar43._20_4_ = auVar44._20_4_ + fVar2 * pfVar30[5];
            auVar43._24_4_ = auVar44._24_4_ + fVar2 * pfVar30[6];
            auVar43._28_4_ = in_ZMM3._28_4_ + in_ZMM2._28_4_;
            in_ZMM2 = ZEXT3264(auVar43);
            *(undefined1 (*) [32])((long)pvVar8 + lVar26 + lVar22) = auVar43;
            lVar26 = lVar26 + 0x20;
            lVar19 = lVar19 + 8;
            in_ZMM3 = ZEXT3264(auVar44._0_32_);
          }
          auVar32 = vshufps_avx(auVar34,auVar34,0);
          in_ZMM2 = ZEXT1664(auVar32);
          auVar33 = vshufps_avx(auVar40,auVar40,0);
          in_ZMM3 = ZEXT1664(auVar33);
          for (; iVar27 + 3 < iVar21; iVar27 = iVar27 + 4) {
            pfVar30 = (float *)((long)pvVar6 + lVar26 + lVar23);
            pfVar1 = (float *)((long)pvVar7 + lVar26 + lVar24);
            auVar45._0_4_ = auVar33._0_4_ * *pfVar1 + auVar32._0_4_ * *pfVar30;
            auVar45._4_4_ = auVar33._4_4_ * pfVar1[1] + auVar32._4_4_ * pfVar30[1];
            auVar45._8_4_ = auVar33._8_4_ * pfVar1[2] + auVar32._8_4_ * pfVar30[2];
            auVar45._12_4_ = auVar33._12_4_ * pfVar1[3] + auVar32._12_4_ * pfVar30[3];
            *(undefined1 (*) [16])((long)pvVar8 + lVar26 + lVar22) = auVar45;
            lVar26 = lVar26 + 0x10;
            lVar19 = lVar19 + 4;
          }
          for (; (int)lVar19 < iVar21; lVar19 = lVar19 + 1) {
            fVar14 = fVar3 * *(float *)((long)pvVar7 + lVar19 * 4 + lVar24);
            in_ZMM3 = ZEXT464((uint)fVar14);
            fVar14 = fVar14 + fVar2 * *(float *)((long)pvVar6 + lVar19 * 4 + lVar23);
            in_ZMM2 = ZEXT464((uint)fVar14);
            *(float *)((long)pvVar8 + lVar19 * 4 + lVar22) = fVar14;
          }
        }
        for (uVar20 = 2;
            pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar20 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar25) /
                            0x48); uVar20 = uVar20 + 1) {
          pMVar25 = pMVar25 + uVar20;
          pp_Var5 = this->_vptr_Eltwise_x86_avx;
          for (uVar17 = 0; uVar17 != uVar31; uVar17 = uVar17 + 1) {
            pvVar6 = pMVar25->data;
            sVar9 = pMVar25->elemsize;
            sVar10 = pMVar25->cstep;
            pfVar30 = (float *)(sVar10 * uVar17 * sVar9 + (long)pvVar6);
            pvVar7 = this_00->data;
            sVar11 = this_00->elemsize;
            sVar12 = this_00->cstep;
            pauVar28 = (undefined1 (*) [32])(sVar12 * uVar17 * sVar11 + (long)pvVar7);
            fVar2 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var5[-3]) + uVar20 * 4);
            auVar35._4_4_ = fVar2;
            auVar35._0_4_ = fVar2;
            auVar35._8_4_ = fVar2;
            auVar35._12_4_ = fVar2;
            lVar19 = 0;
            for (iVar27 = 0; iVar27 + 7 < iVar21; iVar27 = iVar27 + 8) {
              auVar41._0_4_ = fVar2 * *pfVar30 + *(float *)*pauVar28;
              auVar41._4_4_ = fVar2 * pfVar30[1] + *(float *)((long)*pauVar28 + 4);
              auVar41._8_4_ = fVar2 * pfVar30[2] + *(float *)((long)*pauVar28 + 8);
              auVar41._12_4_ = fVar2 * pfVar30[3] + *(float *)((long)*pauVar28 + 0xc);
              auVar41._16_4_ = fVar2 * pfVar30[4] + *(float *)((long)*pauVar28 + 0x10);
              auVar41._20_4_ = fVar2 * pfVar30[5] + *(float *)((long)*pauVar28 + 0x14);
              auVar41._24_4_ = fVar2 * pfVar30[6] + *(float *)((long)*pauVar28 + 0x18);
              auVar41._28_4_ = in_ZMM1._28_4_ + *(float *)((long)*pauVar28 + 0x1c);
              in_ZMM1 = ZEXT3264(auVar41);
              *pauVar28 = auVar41;
              pfVar30 = pfVar30 + 8;
              pauVar28 = pauVar28 + 1;
              lVar19 = lVar19 + 8;
            }
            auVar32 = vshufps_avx(auVar35,auVar35,0);
            in_ZMM1 = ZEXT1664(auVar32);
            for (; iVar27 + 3 < iVar21; iVar27 = iVar27 + 4) {
              auVar42._0_4_ = auVar32._0_4_ * *pfVar30 + *(float *)*pauVar28;
              auVar42._4_4_ = auVar32._4_4_ * pfVar30[1] + *(float *)((long)*pauVar28 + 4);
              auVar42._8_4_ = auVar32._8_4_ * pfVar30[2] + *(float *)((long)*pauVar28 + 8);
              auVar42._12_4_ = auVar32._12_4_ * pfVar30[3] + *(float *)((long)*pauVar28 + 0xc);
              *(undefined1 (*) [16])*pauVar28 = auVar42;
              pfVar30 = pfVar30 + 4;
              pauVar28 = (undefined1 (*) [32])((long)*pauVar28 + 0x10);
              lVar19 = lVar19 + 4;
            }
            lVar22 = sVar12 * sVar11 * uVar17;
            for (; (int)lVar19 < iVar21; lVar19 = lVar19 + 1) {
              fVar3 = fVar2 * *(float *)((long)pvVar6 + lVar19 * 4 + sVar10 * sVar9 * uVar17) +
                      *(float *)((long)pvVar7 + lVar19 * 4 + lVar22);
              in_ZMM1 = ZEXT464((uint)fVar3);
              *(float *)((long)pvVar7 + lVar19 * 4 + lVar22) = fVar3;
            }
          }
        }
      }
    }
    iVar27 = 0;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx[-3]) == 2) {
      uVar31 = 2;
      pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar20 = 0;
      if ((int)uVar4 < 1) {
        uVar16 = uVar20;
      }
      for (; uVar20 != uVar16; uVar20 = uVar20 + 1) {
        lVar19 = m->elemsize * m->cstep * uVar20;
        pvVar6 = m->data;
        lVar22 = pMVar25[1].elemsize * pMVar25[1].cstep * uVar20;
        pvVar7 = pMVar25[1].data;
        lVar23 = this_00->elemsize * this_00->cstep * uVar20;
        pvVar8 = this_00->data;
        lVar24 = 0;
        lVar26 = 0;
        for (iVar27 = 0; iVar27 + 7 < iVar21; iVar27 = iVar27 + 8) {
          auVar13 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar6 + lVar26 + lVar19),
                               *(undefined1 (*) [32])((long)pvVar7 + lVar26 + lVar22));
          *(undefined1 (*) [32])((long)pvVar8 + lVar26 + lVar23) = auVar13;
          lVar26 = lVar26 + 0x20;
          lVar24 = lVar24 + 8;
        }
        for (; iVar27 + 3 < iVar21; iVar27 = iVar27 + 4) {
          auVar32 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar6 + lVar26 + lVar19),
                               *(undefined1 (*) [16])((long)pvVar7 + lVar26 + lVar22));
          *(undefined1 (*) [16])((long)pvVar8 + lVar26 + lVar23) = auVar32;
          lVar26 = lVar26 + 0x10;
          lVar24 = lVar24 + 4;
        }
        for (; (int)lVar24 < iVar21; lVar24 = lVar24 + 1) {
          auVar32 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar7 + lVar24 * 4 + lVar22)),
                               ZEXT416(*(uint *)((long)pvVar6 + lVar24 * 4 + lVar19)));
          *(int *)((long)pvVar8 + lVar24 * 4 + lVar23) = auVar32._0_4_;
        }
      }
      for (; pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
          uVar31 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar25) / 0x48);
          uVar31 = uVar31 + 1) {
        pMVar25 = pMVar25 + uVar31;
        for (uVar20 = 0; uVar20 != uVar16; uVar20 = uVar20 + 1) {
          pvVar6 = pMVar25->data;
          sVar9 = pMVar25->elemsize;
          sVar10 = pMVar25->cstep;
          pauVar28 = (undefined1 (*) [32])(sVar10 * uVar20 * sVar9 + (long)pvVar6);
          pvVar7 = this_00->data;
          sVar11 = this_00->elemsize;
          sVar12 = this_00->cstep;
          pauVar29 = (undefined1 (*) [32])(sVar12 * uVar20 * sVar11 + (long)pvVar7);
          lVar19 = 0;
          for (iVar27 = 0; iVar27 + 7 < iVar21; iVar27 = iVar27 + 8) {
            auVar13 = vmaxps_avx(*pauVar29,*pauVar28);
            *pauVar29 = auVar13;
            pauVar28 = pauVar28 + 1;
            pauVar29 = pauVar29 + 1;
            lVar19 = lVar19 + 8;
          }
          for (; iVar27 + 3 < iVar21; iVar27 = iVar27 + 4) {
            auVar32 = vmaxps_avx(*(undefined1 (*) [16])*pauVar29,*(undefined1 (*) [16])*pauVar28);
            *(undefined1 (*) [16])*pauVar29 = auVar32;
            pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
            pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
            lVar19 = lVar19 + 4;
          }
          lVar22 = sVar12 * sVar11 * uVar20;
          for (; (int)lVar19 < iVar21; lVar19 = lVar19 + 1) {
            auVar32 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar7 + lVar19 * 4 + lVar22)),
                                 ZEXT416(*(uint *)((long)pvVar6 +
                                                  lVar19 * 4 + sVar10 * sVar9 * uVar20)));
            *(int *)((long)pvVar7 + lVar19 * 4 + lVar22) = auVar32._0_4_;
          }
        }
      }
      iVar27 = 0;
    }
  }
  return iVar27;
}

Assistant:

int Eltwise_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}